

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlayoutitem.cpp
# Opt level: O0

bool __thiscall QWidgetItem::isEmpty(QWidgetItem *this)

{
  bool bVar1;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  bool local_21;
  anon_union_4_2_313b0b05_for_QSizePolicy_1 local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QWidget::isHidden((QWidget *)0x34682e);
  if (bVar1) {
    local_c.bits = (Bits)QWidget::sizePolicy(in_RDI);
    bVar1 = QSizePolicy::retainSizeWhenHidden((QSizePolicy *)&local_c.bits);
    local_21 = true;
    if (!bVar1) goto LAB_00346871;
  }
  local_21 = QWidget::isWindow(in_RDI);
LAB_00346871:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_21;
}

Assistant:

bool QWidgetItem::isEmpty() const
{
    return (wid->isHidden() && !wid->sizePolicy().retainSizeWhenHidden()) || wid->isWindow();
}